

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O1

bool MeCab::Connector::compile(char *ifile,char *ofile)

{
  long lVar1;
  char *pcVar2;
  istringstream *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  ostream *poVar11;
  long *plVar12;
  char *pcVar13;
  ulong uVar14;
  char **ppcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  bool bVar20;
  unsigned_short lsize;
  unsigned_short rsize;
  vector<short,_std::allocator<short>_> matrix;
  char *column [4];
  ofstream ofs;
  istringstream iss;
  ifstream ifs;
  ushort local_60e;
  ushort local_60c;
  die local_609;
  char *local_608;
  char *local_600;
  vector<short,_std::allocator<short>_> local_5f8;
  istringstream *local_5e0;
  char *local_5d8 [4];
  undefined1 *local_5b8;
  filebuf local_5b0 [8];
  undefined1 local_5a8 [16];
  byte abStack_598 [216];
  ios_base local_4c0 [264];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_600 = ofile;
  std::ifstream::ifstream((istringstream *)local_238,ifile,_S_in);
  local_5b8 = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"1 1\n0 0 0\n","");
  std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_5b8,_S_in);
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  pcVar13 = local_600;
  local_5e0 = (istringstream *)local_238;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    if (ifile == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x17b498);
    }
    else {
      sVar8 = strlen(ifile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,ifile,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," is not found. minimum setting is used.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    local_5e0 = local_3b8;
  }
  pcVar9 = (char *)operator_new__(0x2000);
  std::ios::widen((char)*(undefined8 *)(*(long *)local_5e0 + -0x18) + (char)local_5e0);
  std::istream::getline((char *)local_5e0,(long)pcVar9,'\0');
  sVar8 = strlen(pcVar9);
  pcVar10 = pcVar9 + sVar8;
  ppcVar15 = local_5d8;
  uVar14 = 0;
  pcVar16 = pcVar9;
  do {
    pcVar18 = pcVar10;
    pcVar2 = pcVar16;
    if (1 < uVar14) break;
    for (; pcVar17 = pcVar10, pcVar2 != pcVar10; pcVar2 = pcVar2 + 1) {
      if (*pcVar2 != '\t') {
        lVar19 = 0;
        do {
          bVar20 = lVar19 == 1;
          pcVar17 = pcVar18;
          if (bVar20) goto LAB_00133488;
          lVar1 = lVar19 + 1;
          lVar19 = lVar19 + 1;
        } while (*pcVar2 != "\t "[lVar1]);
      }
      bVar20 = false;
      pcVar17 = pcVar2;
LAB_00133488:
      if (!bVar20) break;
      pcVar18 = pcVar17;
    }
    *pcVar17 = '\0';
    if (*pcVar16 != '\0') {
      *ppcVar15 = pcVar16;
      ppcVar15 = ppcVar15 + 1;
      uVar14 = uVar14 + 1;
    }
    pcVar16 = pcVar17 + 1;
  } while (pcVar17 != pcVar10);
  if (uVar14 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"tokenize2(buf.get(), \"\\t \", column, 2) == 2",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"format error: ",0xe);
    sVar8 = strlen(pcVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar9,sVar8);
    die::~die((die *)&local_5b8);
  }
  local_608 = pcVar9;
  uVar4 = atoi(local_5d8[0]);
  local_60e = (ushort)uVar4;
  uVar5 = atoi(local_5d8[1]);
  local_60c = (ushort)uVar5;
  std::vector<short,_std::allocator<short>_>::vector
            (&local_5f8,(ulong)((uVar5 & 0xffff) * (uVar4 & 0xffff)),(allocator_type *)&local_5b8);
  if (local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    memset(local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start,0,
           ((long)local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-2 - (long)local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start) & 0xfffffffffffffffeU) + 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  if (ifile == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17b2c8);
  }
  else {
    sVar8 = strlen(ifile);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,ifile,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ... ",5);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"x",1);
  poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  do {
    piVar3 = local_5e0;
    std::ios::widen((char)*(undefined8 *)(*(long *)local_5e0 + -0x18) + (char)local_5e0);
    plVar12 = (long *)std::istream::getline((char *)piVar3,(long)local_608,'\0');
    pcVar16 = local_608;
    if ((*(byte *)((long)plVar12 + *(long *)(*plVar12 + -0x18) + 0x20) & 5) != 0) {
      std::ofstream::ofstream(&local_5b8,pcVar13,_S_out|_S_bin);
      pcVar16 = local_608;
      if ((abStack_598[*(long *)(local_5b8 + -0x18)] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"ofs",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"permission denied: ",0x13);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar8);
        }
        die::~die(&local_609);
      }
      std::ostream::write((char *)&local_5b8,(long)&local_60e);
      std::ostream::write((char *)&local_5b8,(long)&local_60c);
      std::ostream::write((char *)&local_5b8,
                          (long)local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_start);
      std::ofstream::close();
      local_5b8 = _VTT;
      *(undefined8 *)(local_5b0 + *(long *)(_VTT + -0x18) + -8) = _log;
      std::filebuf::~filebuf(local_5b0);
      std::ios_base::~ios_base(local_4c0);
      if (local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      operator_delete__(pcVar16);
      std::__cxx11::istringstream::~istringstream(local_3b8);
      std::ios_base::~ios_base(local_340);
      std::ifstream::~ifstream(local_238);
      return true;
    }
    sVar8 = strlen(local_608);
    pcVar13 = pcVar16 + sVar8;
    ppcVar15 = local_5d8;
    uVar14 = 0;
    do {
      pcVar9 = pcVar13;
      pcVar10 = pcVar16;
      if (2 < uVar14) break;
      for (; pcVar18 = pcVar13, pcVar10 != pcVar13; pcVar10 = pcVar10 + 1) {
        if (*pcVar10 != '\t') {
          lVar19 = 0;
          do {
            bVar20 = lVar19 == 1;
            pcVar18 = pcVar9;
            if (bVar20) goto LAB_00133740;
            lVar1 = lVar19 + 1;
            lVar19 = lVar19 + 1;
          } while (*pcVar10 != "\t "[lVar1]);
        }
        bVar20 = false;
        pcVar18 = pcVar10;
LAB_00133740:
        if (!bVar20) break;
        pcVar9 = pcVar18;
      }
      *pcVar18 = '\0';
      if (*pcVar16 != '\0') {
        *ppcVar15 = pcVar16;
        ppcVar15 = ppcVar15 + 1;
        uVar14 = uVar14 + 1;
      }
      pcVar16 = pcVar18 + 1;
    } while (pcVar18 != pcVar13);
    if (uVar14 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"tokenize2(buf.get(), \"\\t \", column, 3) == 3",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"format error: ",0xe);
      pcVar13 = local_608;
      sVar8 = strlen(local_608);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar13,sVar8);
      die::~die((die *)&local_5b8);
    }
    iVar6 = atoi(local_5d8[0]);
    uVar14 = (ulong)iVar6;
    iVar6 = atoi(local_5d8[1]);
    iVar7 = atoi(local_5d8[2]);
    if ((local_60e <= uVar14) || ((ulong)local_60c <= (ulong)(long)iVar6)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x62);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"l < lsize && r < rsize",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"index values are out of range",0x1d);
      die::~die((die *)&local_5b8);
    }
    progress_bar("emitting matrix      ",uVar14 + 1,(ulong)local_60e);
    local_5f8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start[(ulong)local_60e * (long)iVar6 + uVar14] = (short)iVar7;
    pcVar13 = local_600;
  } while( true );
}

Assistant:

bool Connector::compile(const char *ifile, const char *ofile) {
  std::ifstream ifs(WPATH(ifile));
  std::istringstream iss(MATRIX_DEF_DEFAULT);
  std::istream *is = &ifs;

  if (!ifs) {
    std::cerr << ifile
              << " is not found. minimum setting is used." << std::endl;
    is = &iss;
  }


  char *column[4];
  scoped_fixed_array<char, BUF_SIZE> buf;

  is->getline(buf.get(), buf.size());

  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();

  const unsigned short lsize = std::atoi(column[0]);
  const unsigned short rsize = std::atoi(column[1]);
  std::vector<short> matrix(lsize * rsize);
  std::fill(matrix.begin(), matrix.end(), 0);

  std::cout << "reading " << ifile << " ... "
            << lsize << "x" << rsize << std::endl;

  while (is->getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t ", column, 3) == 3)
        << "format error: " << buf.get();
    const size_t l = std::atoi(column[0]);
    const size_t r = std::atoi(column[1]);
    const int    c = std::atoi(column[2]);
    CHECK_DIE(l < lsize && r < rsize) << "index values are out of range";
    progress_bar("emitting matrix      ", l + 1, lsize);
    matrix[(l + lsize * r)] = static_cast<short>(c);
  }

  std::ofstream ofs(WPATH(ofile), std::ios::binary|std::ios::out);
  CHECK_DIE(ofs) << "permission denied: " << ofile;
  ofs.write(reinterpret_cast<const char*>(&lsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&rsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&matrix[0]),
            lsize * rsize * sizeof(short));
  ofs.close();

  return true;
}